

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

PacketBuilder * __thiscall PacketBuilder::AddShort(PacketBuilder *this,unsigned_short num)

{
  undefined6 in_register_00000032;
  undefined1 local_14 [4];
  
  PacketProcessor::ENumber((uint)CONCAT62(in_register_00000032,num));
  std::__cxx11::string::append((char *)&this->data,(ulong)local_14);
  return this;
}

Assistant:

PacketBuilder &PacketBuilder::AddShort(unsigned short num)
{
#ifdef DEBUG
	std::size_t capacity_before = this->Capacity();
#endif

	this->data.append((char *)PacketProcessor::ENumber(num).data(), 2);

#ifdef DEBUG
	if (this->data.length() > capacity_before)
		debug_packetbuilder_overflow(this, capacity_before);
#endif

	return *this;
}